

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackGenerator.cxx
# Opt level: O0

cmCPackComponent * __thiscall
cmCPackGenerator::GetComponent(cmCPackGenerator *this,string *projectName,string *name)

{
  bool bVar1;
  int iVar2;
  size_type sVar3;
  char *pcVar4;
  undefined4 extraout_var;
  vector<cmCPackInstallationType_*,_std::allocator<cmCPackInstallationType_*>_> *this_00;
  undefined4 extraout_var_00;
  reference pbVar5;
  undefined4 extraout_var_01;
  bool local_31d;
  value_type local_300;
  cmCPackComponent *child;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2f0;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_2e8;
  iterator dependIt;
  string local_2d8;
  undefined1 local_2b8 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  dependsVector;
  char *depends;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_268;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_260;
  iterator installTypesIt;
  string local_250;
  undefined1 local_230 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  installTypesVector;
  char *installTypes;
  char *local_1d0;
  char *description;
  string local_1c0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  char *local_180;
  char *groupName;
  char *local_158;
  char *archiveFile;
  string local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  char *local_88;
  char *displayName;
  string local_70;
  undefined1 local_50 [8];
  string macroPrefix;
  cmCPackComponent *component;
  bool hasComponent;
  string *name_local;
  string *projectName_local;
  cmCPackGenerator *this_local;
  
  sVar3 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent>_>_>
          ::count(&this->Components,name);
  macroPrefix.field_2._8_8_ =
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent>_>_>
       ::operator[](&this->Components,name);
  if (sVar3 == 0) {
    cmsys::SystemTools::UpperCase(&local_70,name);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
                   "CPACK_COMPONENT_",&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::operator=((string *)macroPrefix.field_2._8_8_,(string *)name);
    std::operator+(&local_a8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
                   "_DISPLAY_NAME");
    pcVar4 = GetOption(this,&local_a8);
    std::__cxx11::string::~string((string *)&local_a8);
    local_88 = pcVar4;
    if ((pcVar4 == (char *)0x0) || (*pcVar4 == '\0')) {
      std::__cxx11::string::operator=
                ((string *)(macroPrefix.field_2._8_8_ + 0x20),(string *)macroPrefix.field_2._8_8_);
    }
    else {
      std::__cxx11::string::operator=((string *)(macroPrefix.field_2._8_8_ + 0x20),pcVar4);
    }
    std::operator+(&local_c8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
                   "_HIDDEN");
    bVar1 = IsOn(this,&local_c8);
    *(byte *)(macroPrefix.field_2._8_8_ + 0x48) =
         *(byte *)(macroPrefix.field_2._8_8_ + 0x48) & 0xfd | bVar1 * '\x02';
    std::__cxx11::string::~string((string *)&local_c8);
    std::operator+(&local_e8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
                   "_REQUIRED");
    bVar1 = IsOn(this,&local_e8);
    *(byte *)(macroPrefix.field_2._8_8_ + 0x48) =
         *(byte *)(macroPrefix.field_2._8_8_ + 0x48) & 0xfe | bVar1;
    std::__cxx11::string::~string((string *)&local_e8);
    std::operator+(&local_108,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
                   "_DISABLED");
    bVar1 = IsOn(this,&local_108);
    *(byte *)(macroPrefix.field_2._8_8_ + 0x48) =
         *(byte *)(macroPrefix.field_2._8_8_ + 0x48) & 0xfb | bVar1 << 2;
    std::__cxx11::string::~string((string *)&local_108);
    archiveFile._6_1_ = 0;
    archiveFile._5_1_ = 0;
    std::operator+(&local_128,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
                   "_DOWNLOADED");
    bVar1 = IsOn(this,&local_128);
    local_31d = true;
    if (!bVar1) {
      std::allocator<char>::allocator();
      archiveFile._6_1_ = 1;
      std::__cxx11::string::string
                ((string *)&local_148,"CPACK_DOWNLOAD_ALL",(allocator *)((long)&archiveFile + 7));
      archiveFile._5_1_ = 1;
      pcVar4 = GetOption(this,&local_148);
      local_31d = cmSystemTools::IsOn(pcVar4);
    }
    *(byte *)(macroPrefix.field_2._8_8_ + 0x48) =
         *(byte *)(macroPrefix.field_2._8_8_ + 0x48) & 0xf7 | local_31d << 3;
    if ((archiveFile._5_1_ & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_148);
    }
    if ((archiveFile._6_1_ & 1) != 0) {
      std::allocator<char>::~allocator((allocator<char> *)((long)&archiveFile + 7));
    }
    std::__cxx11::string::~string((string *)&local_128);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&groupName,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
                   "_ARCHIVE_FILE");
    pcVar4 = GetOption(this,(string *)&groupName);
    std::__cxx11::string::~string((string *)&groupName);
    local_158 = pcVar4;
    if ((pcVar4 != (char *)0x0) && (*pcVar4 != '\0')) {
      std::__cxx11::string::operator=((string *)(macroPrefix.field_2._8_8_ + 0x88),pcVar4);
    }
    std::operator+(&local_1a0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
                   "_GROUP");
    pcVar4 = GetOption(this,&local_1a0);
    std::__cxx11::string::~string((string *)&local_1a0);
    local_180 = pcVar4;
    if ((pcVar4 == (char *)0x0) || (*pcVar4 == '\0')) {
      *(undefined8 *)(macroPrefix.field_2._8_8_ + 0x40) = 0;
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1c0,pcVar4,(allocator *)((long)&description + 7));
      iVar2 = (*(this->super_cmObject)._vptr_cmObject[0x1b])(this,projectName,local_1c0);
      *(ulong *)(macroPrefix.field_2._8_8_ + 0x40) = CONCAT44(extraout_var,iVar2);
      std::__cxx11::string::~string(local_1c0);
      std::allocator<char>::~allocator((allocator<char> *)((long)&description + 7));
      std::vector<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_>::push_back
                ((vector<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_> *)
                 (*(long *)(macroPrefix.field_2._8_8_ + 0x40) + 0x68),
                 (value_type *)((long)&macroPrefix.field_2 + 8));
    }
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &installTypes,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
                   "_DESCRIPTION");
    pcVar4 = GetOption(this,(string *)&installTypes);
    std::__cxx11::string::~string((string *)&installTypes);
    local_1d0 = pcVar4;
    if ((pcVar4 != (char *)0x0) && (*pcVar4 != '\0')) {
      std::__cxx11::string::operator=((string *)(macroPrefix.field_2._8_8_ + 0x50),pcVar4);
    }
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &installTypesVector.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
                   "_INSTALL_TYPES");
    pcVar4 = GetOption(this,(string *)
                            &installTypesVector.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::__cxx11::string::~string
              ((string *)
               &installTypesVector.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if ((pcVar4 != (char *)0x0) && (*pcVar4 != '\0')) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_230);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_250,pcVar4,(allocator *)((long)&installTypesIt._M_current + 7));
      cmSystemTools::ExpandListArgument
                (&local_250,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_230,false);
      std::__cxx11::string::~string((string *)&local_250);
      std::allocator<char>::~allocator((allocator<char> *)((long)&installTypesIt._M_current + 7));
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::__normal_iterator(&local_260);
      local_268 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_230);
      local_260._M_current = local_268;
      while( true ) {
        local_270._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_230);
        bVar1 = __gnu_cxx::operator!=(&local_260,&local_270);
        if (!bVar1) break;
        this_00 = (vector<cmCPackInstallationType_*,_std::allocator<cmCPackInstallationType_*>_> *)
                  (macroPrefix.field_2._8_8_ + 0x70);
        pbVar5 = __gnu_cxx::
                 __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&local_260);
        iVar2 = (*(this->super_cmObject)._vptr_cmObject[0x19])(this,projectName,pbVar5);
        depends = (char *)CONCAT44(extraout_var_00,iVar2);
        std::vector<cmCPackInstallationType_*,_std::allocator<cmCPackInstallationType_*>_>::
        push_back(this_00,(value_type *)&depends);
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&local_260);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_230);
    }
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &dependsVector.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
                   "_DEPENDS");
    pcVar4 = GetOption(this,(string *)
                            &dependsVector.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::__cxx11::string::~string
              ((string *)
               &dependsVector.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if ((pcVar4 != (char *)0x0) && (*pcVar4 != '\0')) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_2b8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_2d8,pcVar4,(allocator *)((long)&dependIt._M_current + 7));
      cmSystemTools::ExpandListArgument
                (&local_2d8,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_2b8,false);
      std::__cxx11::string::~string((string *)&local_2d8);
      std::allocator<char>::~allocator((allocator<char> *)((long)&dependIt._M_current + 7));
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::__normal_iterator(&local_2e8);
      local_2f0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_2b8);
      local_2e8._M_current = local_2f0;
      while( true ) {
        child = (cmCPackComponent *)
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_2b8);
        bVar1 = __gnu_cxx::operator!=
                          (&local_2e8,
                           (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)&child);
        if (!bVar1) break;
        pbVar5 = __gnu_cxx::
                 __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&local_2e8);
        iVar2 = (*(this->super_cmObject)._vptr_cmObject[0x1a])(this,projectName,pbVar5);
        local_300 = (value_type)CONCAT44(extraout_var_01,iVar2);
        std::vector<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_>::push_back
                  ((vector<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_> *)
                   (macroPrefix.field_2._8_8_ + 0xa8),&local_300);
        std::vector<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_>::push_back
                  (&local_300->ReverseDependencies,(value_type *)((long)&macroPrefix.field_2 + 8));
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&local_2e8);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_2b8);
    }
    std::__cxx11::string::~string((string *)local_50);
  }
  return (cmCPackComponent *)macroPrefix.field_2._8_8_;
}

Assistant:

cmCPackComponent*
cmCPackGenerator::GetComponent(const std::string& projectName,
                               const std::string& name)
{
  bool hasComponent = this->Components.count(name) != 0;
  cmCPackComponent *component = &this->Components[name];
  if (!hasComponent)
    {
    // Define the component
    std::string macroPrefix = "CPACK_COMPONENT_"
      + cmsys::SystemTools::UpperCase(name);
    component->Name = name;
    const char* displayName
      = this->GetOption(macroPrefix + "_DISPLAY_NAME");
    if (displayName && *displayName)
      {
      component->DisplayName = displayName;
      }
    else
      {
      component->DisplayName = component->Name;
      }
    component->IsHidden
      = this->IsOn(macroPrefix + "_HIDDEN");
    component->IsRequired
      = this->IsOn(macroPrefix + "_REQUIRED");
    component->IsDisabledByDefault
      = this->IsOn(macroPrefix + "_DISABLED");
    component->IsDownloaded
      = this->IsOn(macroPrefix + "_DOWNLOADED")
        || cmSystemTools::IsOn(this->GetOption("CPACK_DOWNLOAD_ALL"));

    const char* archiveFile = this->GetOption(macroPrefix +
                                               "_ARCHIVE_FILE");
    if (archiveFile && *archiveFile)
      {
      component->ArchiveFile = archiveFile;
      }

    const char* groupName = this->GetOption(macroPrefix + "_GROUP");
    if (groupName && *groupName)
      {
      component->Group = GetComponentGroup(projectName, groupName);
      component->Group->Components.push_back(component);
      }
    else
      {
      component->Group = 0;
      }

    const char* description
      = this->GetOption(macroPrefix + "_DESCRIPTION");
    if (description && *description)
      {
      component->Description = description;
      }

    // Determine the installation types.
    const char *installTypes
      = this->GetOption(macroPrefix + "_INSTALL_TYPES");
    if (installTypes && *installTypes)
      {
      std::vector<std::string> installTypesVector;
      cmSystemTools::ExpandListArgument(installTypes, installTypesVector);
      std::vector<std::string>::iterator installTypesIt;
      for (installTypesIt = installTypesVector.begin();
           installTypesIt != installTypesVector.end();
           ++installTypesIt)
        {
        component->InstallationTypes.push_back(
          this->GetInstallationType(projectName, *installTypesIt));
        }
      }

    // Determine the component dependencies.
    const char *depends = this->GetOption(macroPrefix + "_DEPENDS");
    if (depends && *depends)
      {
      std::vector<std::string> dependsVector;
      cmSystemTools::ExpandListArgument(depends, dependsVector);
      std::vector<std::string>::iterator dependIt;
      for (dependIt = dependsVector.begin();
           dependIt != dependsVector.end();
           ++dependIt)
        {
        cmCPackComponent *child = GetComponent(projectName,
                                               *dependIt);
        component->Dependencies.push_back(child);
        child->ReverseDependencies.push_back(component);
        }
      }
    }
  return component;
}